

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtUtxoDataByIndex
              (void *handle,void *psbt_handle,uint32_t index,char **txid,uint32_t *vout,
              int64_t *amount,char **locking_script,char **redeem_script,char **descriptor,
              char **full_tx_hex)

{
  string *psVar1;
  pointer pKVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  char *pcVar7;
  char *pcVar8;
  int64_t iVar9;
  char *pcVar10;
  CfdException *this;
  pointer this_00;
  pointer this_01;
  char *local_7c0;
  char *local_7b8;
  uint32_t req_num;
  string local_7a0;
  char *work_tx;
  char *work_redeem_script;
  char *work_locking_script;
  char *work_txid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  char *work_descriptor;
  TxOutReference txout;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> multisig_key_list;
  Script temp_script;
  OutPoint outpoint;
  Script script;
  Transaction tx;
  TxInReference txin;
  UtxoData utxo;
  
  work_txid = (char *)0x0;
  work_locking_script = (char *)0x0;
  work_redeem_script = (char *)0x0;
  work_tx = (char *)0x0;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&utxo,"PsbtHandle",(allocator *)&txin);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  if (*(Psbt **)((long)psbt_handle + 0x18) == (Psbt *)0x0) {
    utxo.block_height =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
         + 0x56;
    utxo.block_hash._vptr_BlockHash._0_4_ = 0x49a;
    utxo.block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "CfdGetPsbtUtxoDataByIndex";
    cfd::core::logger::warn<>((CfdSourceLocation *)&utxo,"psbt is null.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&utxo,"Failed to handle statement. psbt is null.",(allocator *)&txin);
    cfd::core::CfdException::CfdException(this,kCfdIllegalStateError,(string *)&utxo);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Psbt::GetTransaction((Transaction *)&utxo,*(Psbt **)((long)psbt_handle + 0x18));
  cfd::core::Transaction::GetTxIn(&txin,(Transaction *)&utxo,index);
  cfd::core::Transaction::~Transaction((Transaction *)&utxo);
  cfd::core::AbstractTxInReference::GetOutPoint(&outpoint,&txin.super_AbstractTxInReference);
  if (txid == (char **)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    cfd::core::OutPoint::GetTxid((Txid *)&txout,&outpoint);
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&utxo,(Txid *)&txout);
    pcVar7 = cfd::capi::CreateString((string *)&utxo);
    work_txid = pcVar7;
    std::__cxx11::string::~string((string *)&utxo);
    cfd::core::Txid::~Txid((Txid *)&txout);
  }
  if (vout != (uint32_t *)0x0) {
    uVar5 = cfd::core::OutPoint::GetVout(&outpoint);
    *vout = uVar5;
  }
  cfd::Psbt::GetUtxoData(&utxo,*(Psbt **)((long)psbt_handle + 0x18),index,kMainnet);
  bVar3 = cfd::core::Script::IsEmpty(&utxo.locking_script);
  if (bVar3) {
    pcVar8 = (char *)0x0;
  }
  else {
    if (locking_script == (char **)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&txout,&utxo.locking_script);
      pcVar8 = cfd::capi::CreateString((string *)&txout);
      work_locking_script = pcVar8;
      std::__cxx11::string::~string((string *)&txout);
    }
    if (amount != (int64_t *)0x0) {
      iVar9 = cfd::core::Amount::GetSatoshiValue(&utxo.amount);
      *amount = iVar9;
    }
  }
  cfd::core::Psbt::GetTxInRedeemScript
            (&script,*(Psbt **)((long)psbt_handle + 0x18),index,true,(bool *)0x0);
  bVar3 = cfd::core::Script::IsEmpty(&script);
  if ((bVar3) ||
     (bVar3 = cfd::core::Script::IsP2wpkhScript(&script), redeem_script == (char **)0x0 || bVar3)) {
    local_7b8 = (char *)0x0;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)&txout,&script);
    local_7b8 = cfd::capi::CreateString((string *)&txout);
    work_redeem_script = local_7b8;
    std::__cxx11::string::~string((string *)&txout);
  }
  cfd::core::Psbt::GetTxInUtxoFull(&tx,*(Psbt **)((long)psbt_handle + 0x18),index,true,(bool *)0x0);
  cfd::core::TxOutReference::TxOutReference(&txout);
  uVar5 = cfd::core::Transaction::GetTxOutCount(&tx);
  uVar6 = cfd::core::OutPoint::GetVout(&outpoint);
  if (uVar6 < uVar5) {
    uVar5 = cfd::core::OutPoint::GetVout(&outpoint);
    cfd::core::Transaction::GetTxOut((TxOutReference *)&temp_script,&tx,uVar5);
    cfd::core::AbstractTxOutReference::operator=
              (&txout.super_AbstractTxOutReference,(AbstractTxOutReference *)&temp_script);
    cfd::core::AbstractTxOutReference::~AbstractTxOutReference
              ((AbstractTxOutReference *)&temp_script);
    if (full_tx_hex != (char **)0x0) {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&temp_script,&tx.super_AbstractTransaction);
      local_7c0 = cfd::capi::CreateString((string *)&temp_script);
      work_tx = local_7c0;
      std::__cxx11::string::~string((string *)&temp_script);
      goto LAB_003870ed;
    }
  }
  local_7c0 = (char *)0x0;
LAB_003870ed:
  cfd::core::Psbt::GetTxInKeyDataList(&key_list,*(Psbt **)((long)psbt_handle + 0x18),index);
  psVar1 = &utxo.descriptor;
  if (utxo.descriptor._M_string_length == 0) {
    cfd::core::Script::Script(&temp_script,&txout.super_AbstractTxOutReference.locking_script_);
    bVar3 = cfd::core::Script::IsP2shScript(&temp_script);
    if ((bVar3) && (bVar3 = cfd::core::Script::IsMultisigScript(&script), bVar3)) {
      req_num = 0;
      cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript(&multisig_key_list,&script,&req_num);
      std::__cxx11::to_string(&local_7a0,req_num);
      std::operator+(&local_760,"multi(",&local_7a0);
      std::__cxx11::string::operator=((string *)&utxo.descriptor,(string *)&local_760);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_7a0);
      for (this_01 = multisig_key_list.
                     super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pKVar2 = key_list.
                   super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
          this_01 !=
          multisig_key_list.
          super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
          super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
        bVar3 = false;
        for (this_00 = key_list.
                       super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                       _M_impl.super__Vector_impl_data._M_start; this_00 != pKVar2;
            this_00 = this_00 + 1) {
          cfd::core::KeyData::GetPubkey((Pubkey *)&local_760,this_00);
          bVar4 = cfd::core::Pubkey::Equals(this_01,(Pubkey *)&local_760);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_760);
          if (bVar4) {
            cfd::core::KeyData::ToString_abi_cxx11_(&local_7a0,this_00,true,kApostrophe,false);
            std::operator+(&local_760,",",&local_7a0);
            std::__cxx11::string::append((string *)&utxo.descriptor);
            std::__cxx11::string::~string((string *)&local_760);
            std::__cxx11::string::~string((string *)&local_7a0);
            bVar3 = true;
          }
        }
        if (!bVar3) {
          cfd::core::Pubkey::GetHex_abi_cxx11_(&local_7a0,this_01);
          std::operator+(&local_760,",",&local_7a0);
          std::__cxx11::string::append((string *)&utxo.descriptor);
          std::__cxx11::string::~string((string *)&local_760);
          std::__cxx11::string::~string((string *)&local_7a0);
        }
      }
      std::operator+(&local_7a0,"sh(",&utxo.descriptor);
      std::operator+(&local_760,&local_7a0,")");
      std::__cxx11::string::operator=((string *)&utxo.descriptor,(string *)&local_760);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                (&multisig_key_list);
    }
    else {
      bVar3 = cfd::core::Script::IsP2pkhScript(&temp_script);
      if (((bVar3) || (bVar3 = cfd::core::Script::IsP2pkScript(&temp_script), bVar3)) &&
         ((long)key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x150)) {
        bVar3 = cfd::core::Script::IsP2pkhScript(&temp_script);
        if ((bVar3) || (bVar3 = cfd::core::Script::IsP2pkScript(&temp_script), bVar3)) {
          std::__cxx11::string::assign((char *)psVar1);
        }
        cfd::core::KeyData::ToString_abi_cxx11_
                  (&local_760,
                   key_list.
                   super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                   _M_impl.super__Vector_impl_data._M_start,true,kApostrophe,false);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::append((char *)psVar1);
      }
    }
    cfd::core::Script::~Script(&temp_script);
    bVar3 = utxo.descriptor._M_string_length == 0;
  }
  else {
    bVar3 = false;
  }
  pcVar10 = (char *)0x0;
  if ((descriptor != (char **)0x0) && (!bVar3)) {
    pcVar10 = cfd::capi::CreateString(&utxo.descriptor);
  }
  if (txid != (char **)0x0) {
    *txid = pcVar7;
  }
  if (locking_script != (char **)0x0) {
    *locking_script = pcVar8;
  }
  if (redeem_script != (char **)0x0) {
    *redeem_script = local_7b8;
  }
  if (descriptor != (char **)0x0) {
    *descriptor = pcVar10;
  }
  if (full_tx_hex != (char **)0x0) {
    *full_tx_hex = local_7c0;
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
  cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&txout.super_AbstractTxOutReference);
  cfd::core::Transaction::~Transaction(&tx);
  cfd::core::Script::~Script(&script);
  cfd::UtxoData::~UtxoData(&utxo);
  cfd::core::Txid::~Txid(&outpoint.txid_);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&txin.super_AbstractTxInReference);
  return 0;
}

Assistant:

int CfdGetPsbtUtxoDataByIndex(
    void* handle, void* psbt_handle, uint32_t index, char** txid,
    uint32_t* vout, int64_t* amount, char** locking_script,
    char** redeem_script, char** descriptor, char** full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_locking_script = nullptr;
  char* work_redeem_script = nullptr;
  char* work_descriptor = nullptr;
  char* work_tx = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    auto txin = psbt_obj->psbt->GetTransaction().GetTxIn(index);
    OutPoint outpoint = txin.GetOutPoint();
    if (txid != nullptr) {
      work_txid = CreateString(outpoint.GetTxid().GetHex());
    }
    if (vout != nullptr) *vout = outpoint.GetVout();

    auto utxo = psbt_obj->psbt->GetUtxoData(index);
    if (!utxo.locking_script.IsEmpty()) {
      if (locking_script != nullptr) {
        work_locking_script = CreateString(utxo.locking_script.GetHex());
      }
      if (amount != nullptr) *amount = utxo.amount.GetSatoshiValue();
    }

    Script script = psbt_obj->psbt->GetTxInRedeemScript(index, true);
    if ((!script.IsEmpty()) && (!script.IsP2wpkhScript()) &&
        (redeem_script != nullptr)) {
      work_redeem_script = CreateString(script.GetHex());
    }

    auto tx = psbt_obj->psbt->GetTxInUtxoFull(index, true);
    TxOutReference txout;
    if (tx.GetTxOutCount() > outpoint.GetVout()) {
      txout = tx.GetTxOut(outpoint.GetVout());
      if (full_tx_hex != nullptr) work_tx = CreateString(tx.GetHex());
    }

    auto key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
    if (utxo.descriptor.empty()) {
      Script temp_script = txout.GetLockingScript();
      if (temp_script.IsP2shScript() && script.IsMultisigScript()) {
        uint32_t req_num = 0;
        auto multisig_key_list =
            ScriptUtil::ExtractPubkeysFromMultisigScript(script, &req_num);
        utxo.descriptor = "multi(" + std::to_string(req_num);
        for (const auto& pubkey : multisig_key_list) {
          bool is_find = false;
          for (const auto& key : key_list) {
            if (pubkey.Equals(key.GetPubkey())) {
              utxo.descriptor += "," + key.ToString();
              is_find = true;
            }
          }
          if (!is_find) {
            utxo.descriptor += "," + pubkey.GetHex();
          }
        }
        utxo.descriptor = "sh(" + utxo.descriptor + ")";
      } else if (temp_script.IsP2pkhScript() || temp_script.IsP2pkScript()) {
        if (key_list.size() == 1) {
          if (temp_script.IsP2pkhScript())
            utxo.descriptor = "pkh(";
          else if (temp_script.IsP2pkScript())
            utxo.descriptor = "pk(";
          utxo.descriptor += key_list[0].ToString();
          utxo.descriptor += ")";
        }
      }
    }
    if ((!utxo.descriptor.empty()) && (descriptor != nullptr)) {
      work_descriptor = CreateString(utxo.descriptor);
    }

    if (txid != nullptr) *txid = work_txid;
    if (locking_script != nullptr) *locking_script = work_locking_script;
    if (redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (descriptor != nullptr) *descriptor = work_descriptor;
    if (full_tx_hex != nullptr) *full_tx_hex = work_tx;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_txid, &work_locking_script, &work_redeem_script, &work_descriptor,
      &work_tx);
  return result;
}